

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinObjectHasEx
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  bool bVar1;
  const_reference pvVar2;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *in_RDX;
  Interpreter *in_RDI;
  Value VVar3;
  Identifier **field;
  iterator __end3;
  iterator __begin3;
  set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  *__range3;
  bool found;
  bool include_hidden;
  HeapString *str;
  HeapObject *obj;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *in_stack_000001b0;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_stack_000001b8;
  string *in_stack_000001c0;
  LocationRange *in_stack_000001c8;
  Interpreter *in_stack_000001d0;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffffec8;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *__lhs;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  allocator<char> *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  _Self local_e8;
  _Self local_e0;
  undefined1 local_d8 [55];
  undefined1 manifesting;
  uint6 in_stack_ffffffffffffff60;
  byte bVar4;
  Interpreter *this_00;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 *local_78;
  undefined8 local_70;
  allocator<char> local_39;
  string local_38 [32];
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *local_18;
  
  manifesting = (undefined1)((ulong)stack0xffffffffffffff58 >> 0x38);
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),in_stack_ffffffffffffff08
             ,in_stack_ffffffffffffff00);
  local_84 = 0x12;
  local_80 = 0x13;
  local_7c = 1;
  local_78 = &local_84;
  local_70 = 3;
  __lhs = local_18;
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x229242);
  __l._M_len._0_4_ = in_stack_ffffffffffffff10;
  __l._M_array = (iterator)in_stack_ffffffffffffff08;
  __l._M_len._4_4_ = in_stack_ffffffffffffff14;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)in_stack_ffffffffffffff00,__l,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  validateBuiltinArgs(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0,in_stack_000001b8,
                      in_stack_000001b0);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
             *)in_RDI);
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::~allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x2292a6);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                *)local_18,0);
  pvVar2 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                         *)local_18,1);
  this_00 = (Interpreter *)(pvVar2->v).h;
  pvVar2 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                         *)local_18,2);
  bVar4 = 0;
  objectFields(this_00,(HeapObject *)
                       (CONCAT17((pvVar2->v).b,(uint7)in_stack_ffffffffffffff60) & 0x1ffffffffffffff
                       ),(bool)manifesting);
  unique0x00004e80 = local_d8;
  local_e0._M_node =
       (_Base_ptr)
       std::
       set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
       ::begin((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                *)in_stack_fffffffffffffec8);
  local_e8._M_node =
       (_Base_ptr)
       std::
       set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
       ::end((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
              *)in_stack_fffffffffffffec8);
  do {
    bVar1 = std::operator!=(&local_e0,&local_e8);
    if (!bVar1) {
LAB_00229466:
      std::
      set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
              *)0x229470);
      VVar3 = makeBoolean(in_RDI,(bool)(bVar4 & 1));
      *(ulong *)&in_RDI->scratch = CONCAT44(in_stack_fffffffffffffefc,VVar3.t);
      (in_RDI->scratch).v = VVar3.v;
      return (AST *)0x0;
    }
    std::_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>::operator*
              ((_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*> *)0x22941f);
    bVar1 = std::operator==(__lhs,in_stack_fffffffffffffec8);
    if (bVar1) {
      bVar4 = 1;
      goto LAB_00229466;
    }
    std::_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>::operator++
              ((_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*> *)__lhs);
  } while( true );
}

Assistant:

const AST *builtinObjectHasEx(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(
            loc, "objectHasEx", args, {Value::OBJECT, Value::STRING, Value::BOOLEAN});
        const auto *obj = static_cast<const HeapObject *>(args[0].v.h);
        const auto *str = static_cast<const HeapString *>(args[1].v.h);
        bool include_hidden = args[2].v.b;
        bool found = false;
        for (const auto &field : objectFields(obj, !include_hidden)) {
            if (field->name == str->value) {
                found = true;
                break;
            }
        }
        scratch = makeBoolean(found);
        return nullptr;
    }